

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  void *in_stack_00000008;
  __m128i m;
  __m128i m0;
  int i;
  __m128i v_maxval;
  int in_stack_00000110;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_8c;
  undefined1 auVar3 [16];
  CONV_BUF_TYPE *in_stack_ffffffffffffffe8;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  
  uVar11 = 0x40;
  uVar10 = 0x40;
  uVar9 = 0x40;
  uVar8 = 0x40;
  uVar7 = 0x40;
  uVar6 = 0x40;
  uVar5 = 0x40;
  uVar4 = 0x40;
  auVar3 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar3 = vpinsrw_avx(auVar3,0x40,2);
  auVar3 = vpinsrw_avx(auVar3,0x40,3);
  auVar3 = vpinsrw_avx(auVar3,0x40,4);
  auVar3 = vpinsrw_avx(auVar3,0x40,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  auVar3 = vpinsrw_avx(auVar3,0x40,7);
  auVar2 = ZEXT1664(auVar3);
  for (local_8c = 0; auVar1 = auVar2._0_16_, local_8c < (int)m[1]; local_8c = local_8c + 1) {
    xx_loadl_32(in_stack_00000008);
    local_a8 = auVar1._0_8_;
    uStack_a0 = auVar1._8_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_a8;
    auVar1 = vpmovzxbw_avx(auVar1);
    auVar2 = ZEXT1664(auVar1);
    blend_a64_d16_mask_w4_sse41
              ((uint8_t *)CONCAT26(uVar11,CONCAT24(uVar10,CONCAT22(uVar9,uVar8))),
               (CONV_BUF_TYPE *)CONCAT26(uVar7,CONCAT24(uVar6,CONCAT22(uVar5,uVar4))),
               in_stack_ffffffffffffffe8,auVar3._8_8_,auVar3._0_8_,uStack_a0,in_stack_00000110);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(uint)m[0]);
  }
  return;
}

Assistant:

static inline void aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  for (int i = 0; i < h; ++i) {
    const __m128i m0 = xx_loadl_32(mask);
    const __m128i m = _mm_cvtepu8_epi16(m0);

    blend_a64_d16_mask_w4_sse41(dst, src0, src1, &m, round_offset, &v_maxval,
                                shift);
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}